

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::writePlotFile(PeleLM *this,string *dir,ostream *os,How how)

{
  Real RVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  CoordType CVar7;
  _Ios_Openmode _Var8;
  TimeCenter TVar9;
  StateDescriptor *pSVar10;
  long lVar11;
  pointer pDVar12;
  size_type sVar13;
  string *psVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  Geometry *pGVar16;
  Real *pRVar17;
  tm *__tp;
  size_t sVar18;
  ulong uVar19;
  char *pcVar20;
  ostream *poVar21;
  Long LVar22;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
  *this_00;
  FabArray<amrex::FArrayBox> *pFVar23;
  reference pvVar24;
  StateData *this_01;
  reference pbVar25;
  FabArrayBase *pFVar26;
  ostream *in_RDX;
  string *in_RSI;
  AmrLevel *in_RDI;
  IntVect IVar27;
  string TheFullPath;
  int nComp;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>
  *kv_1;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
  *__range1_1;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> derive_dat;
  DeriveRec *rec_1;
  int f_lev_1;
  const_iterator end_3;
  const_iterator it_3;
  Real plot_time;
  int comp_2;
  int typ_2;
  unsigned_long i_10;
  MultiFab *this_dat;
  MultiFab plotMF;
  int nGrow;
  int ncomp;
  int cnt;
  int lev;
  string PathNameInHeader;
  int n;
  RealBox gridloc;
  long i_9;
  string FullPath;
  string LevelStr;
  char *githash5;
  char *githash4;
  char *githash3;
  char *githash2;
  char *githash1;
  int nn;
  char currentDir [4096];
  tm *localtm;
  time_t now;
  string PrettyLine;
  string FullPathJobInfoFile;
  ofstream jobInfoFile;
  int k;
  int i_8;
  int i_7;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int f_lev;
  long i_2;
  const_iterator end_2;
  const_iterator it_2;
  int i_1;
  DeriveRec *rec;
  const_iterator end_1;
  const_iterator it_1;
  int comp_1;
  int typ_1;
  unsigned_long i;
  Real tnp1;
  int n_data_items;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>
  *kv;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
  *__range1;
  int num_auxDiag;
  const_iterator end;
  const_iterator it;
  list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *dlist;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  derive_names;
  int num_derive;
  string *name;
  int comp;
  long typ;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> plot_var_map;
  ParmParse pp;
  value_type *in_stack_ffffffffffffe418;
  PeleLM *in_stack_ffffffffffffe420;
  DeriveRec *in_stack_ffffffffffffe428;
  AmrMesh *in_stack_ffffffffffffe430;
  PeleLM *in_stack_ffffffffffffe438;
  int in_stack_ffffffffffffe440;
  undefined1 in_stack_ffffffffffffe444;
  undefined1 in_stack_ffffffffffffe445;
  undefined1 in_stack_ffffffffffffe446;
  undefined1 in_stack_ffffffffffffe447;
  Box *in_stack_ffffffffffffe448;
  RealBox *in_stack_ffffffffffffe450;
  FabArray<amrex::FArrayBox> *this_02;
  string *in_stack_ffffffffffffe458;
  BoxArray *bxs;
  DistributionMapping *this_03;
  FabFactory<amrex::FArrayBox> *factory;
  undefined8 in_stack_ffffffffffffe488;
  undefined1 prettyPrint;
  ostream *in_stack_ffffffffffffe490;
  undefined8 in_stack_ffffffffffffe498;
  bool *in_stack_ffffffffffffe4a0;
  char *in_stack_ffffffffffffe4a8;
  ParmParse *in_stack_ffffffffffffe4b0;
  ostream *in_stack_ffffffffffffe5f0;
  string *in_stack_ffffffffffffe5f8;
  string local_1828 [36];
  int local_1804;
  reference local_1800;
  _Self local_17f8;
  _Self local_17f0;
  undefined1 *local_17e8;
  undefined1 local_17e0 [8];
  AmrMesh *local_17d8;
  int local_17cc;
  iterator local_17c8;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_17c0;
  iterator local_17b8;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_17b0;
  Real local_17a8;
  int local_17a0;
  int local_179c;
  FabArray<amrex::FArrayBox> *local_1798;
  MultiFab *local_1790;
  FabFactory<amrex::FArrayBox> local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined4 local_15e0;
  int local_15dc;
  int local_15d8;
  int local_15d4;
  string local_15d0 [32];
  int local_15b0;
  RealBox local_1590;
  long local_1560;
  string local_1558 [39];
  allocator local_1531;
  string local_1530 [32];
  string local_1510 [39];
  allocator local_14e9;
  char *local_14e8;
  char *local_14e0;
  char *local_14d8;
  char *local_14d0;
  char *local_14c8;
  int local_14bc;
  char local_14b8 [2107];
  undefined1 in_stack_fffffffffffff383;
  How in_stack_fffffffffffff384;
  string *in_stack_fffffffffffff388;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff390;
  time_t local_4b0;
  allocator local_4a1;
  string local_4a0 [32];
  string local_480 [32];
  ostream local_460 [512];
  int local_260;
  int local_25c;
  int local_258;
  int local_254;
  int local_250 [3];
  undefined8 local_240;
  int local_238;
  int local_230;
  int local_22c;
  int local_228;
  int local_224;
  long local_220;
  iterator local_218;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_210;
  iterator local_208;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_200;
  int local_1f4;
  DeriveRec *local_1f0;
  iterator local_1e8;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  iterator local_1d8;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  int local_1c8;
  int local_1c4;
  ulong local_1c0;
  string local_1b8 [32];
  Real local_198;
  int local_18c;
  reference local_188;
  _Self local_180;
  _Self local_178;
  undefined1 *local_170;
  int local_164;
  _Self local_160;
  _Self local_158;
  list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *local_150;
  int local_12c;
  pair<int,_int> local_128;
  pair<int,_int> local_120;
  uint local_118;
  uint local_114;
  string *local_110;
  int local_104;
  long local_100;
  Box local_f8;
  allocator local_c9;
  string local_c8 [128];
  ostream *local_48;
  string *local_40;
  char *local_30;
  undefined4 local_24;
  undefined8 *local_20;
  uint *local_18;
  uint *local_10;
  IndexType local_4;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffe498 >> 0x20);
  local_48 = in_RDX;
  local_40 = in_RSI;
  bVar3 = amrex::Amr::Plot_Files_Output();
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"ht",&local_c9);
    amrex::ParmParse::ParmParse
              ((ParmParse *)in_stack_ffffffffffffe430,&in_stack_ffffffffffffe428->derive_name);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    amrex::ParmParse::query
              (in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4a8,in_stack_ffffffffffffe4a0,iVar5);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x52e5c4);
    for (local_100 = 0; lVar11 = local_100,
        iVar5 = amrex::DescriptorList::size((DescriptorList *)0x52e5ec), lVar11 < iVar5;
        local_100 = local_100 + 1) {
      local_104 = 0;
      while( true ) {
        iVar5 = local_104;
        pSVar10 = amrex::DescriptorList::operator[]
                            ((DescriptorList *)in_stack_ffffffffffffe420,
                             (int)((ulong)in_stack_ffffffffffffe418 >> 0x20));
        iVar6 = amrex::StateDescriptor::nComp(pSVar10);
        if (iVar6 <= iVar5) break;
        amrex::DescriptorList::operator[]
                  ((DescriptorList *)in_stack_ffffffffffffe420,
                   (int)((ulong)in_stack_ffffffffffffe418 >> 0x20));
        local_110 = amrex::StateDescriptor::name_abi_cxx11_
                              ((StateDescriptor *)in_stack_ffffffffffffe420,
                               (int)((ulong)in_stack_ffffffffffffe418 >> 0x20));
        bVar4 = amrex::Amr::isStatePlotVar((string *)in_stack_ffffffffffffe438);
        bVar3 = false;
        if (bVar4) {
          pSVar10 = amrex::DescriptorList::operator[]
                              ((DescriptorList *)in_stack_ffffffffffffe420,
                               (int)((ulong)in_stack_ffffffffffffe418 >> 0x20));
          local_114 = (uint)amrex::StateDescriptor::getType(pSVar10);
          amrex::IndexType::IndexType(&local_4,CELL,CELL,CELL);
          local_118 = local_4.itype;
          local_10 = &local_114;
          local_18 = &local_118;
          bVar3 = local_4.itype == local_114;
        }
        if (bVar3) {
          lVar11 = std::__cxx11::string::find((char *)local_110,0x19520a1);
          if (lVar11 == -1) {
            std::pair<int,_int>::pair<long_&,_int_&,_true>(&local_128,&local_100,&local_104);
            std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       in_stack_ffffffffffffe420,in_stack_ffffffffffffe418);
          }
          else if ((plot_rhoydot & 1U) != 0) {
            std::pair<int,_int>::pair<long_&,_int_&,_true>(&local_120,&local_100,&local_104);
            std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       in_stack_ffffffffffffe420,in_stack_ffffffffffffe418);
          }
        }
        local_104 = local_104 + 1;
      }
    }
    local_12c = 0;
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x52e8a1);
    local_150 = amrex::DeriveList::dlist_abi_cxx11_((DeriveList *)amrex::AmrLevel::derive_lst);
    local_158._M_node =
         (_List_node_base *)
         std::__cxx11::list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>::begin
                   ((list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *)
                    in_stack_ffffffffffffe418);
    local_160._M_node =
         (_List_node_base *)
         std::__cxx11::list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>::end
                   ((list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *)
                    in_stack_ffffffffffffe418);
    while (bVar3 = std::operator!=(&local_158,&local_160), bVar3) {
      pDVar12 = std::_List_const_iterator<amrex::DeriveRec>::operator->
                          ((_List_const_iterator<amrex::DeriveRec> *)in_stack_ffffffffffffe420);
      amrex::DeriveRec::name_abi_cxx11_(pDVar12);
      bVar3 = amrex::Amr::isDerivePlotVar((string *)in_stack_ffffffffffffe438);
      if (bVar3) {
        pDVar12 = std::_List_const_iterator<amrex::DeriveRec>::operator->
                            ((_List_const_iterator<amrex::DeriveRec> *)in_stack_ffffffffffffe420);
        amrex::DeriveRec::name_abi_cxx11_(pDVar12);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffe430,&in_stack_ffffffffffffe428->derive_name);
        pDVar12 = std::_List_const_iterator<amrex::DeriveRec>::operator->
                            ((_List_const_iterator<amrex::DeriveRec> *)in_stack_ffffffffffffe420);
        iVar5 = amrex::DeriveRec::numDerive(pDVar12);
        local_12c = iVar5 + local_12c;
      }
      std::_List_const_iterator<amrex::DeriveRec>::operator++(&local_158);
    }
    local_164 = 0;
    local_170 = &in_RDI[6].field_0x288;
    local_178._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
                  *)in_stack_ffffffffffffe418);
    local_180._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
                *)in_stack_ffffffffffffe418);
    while (bVar3 = std::operator!=(&local_178,&local_180), bVar3) {
      local_188 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                               *)0x52ea1e);
      pFVar26 = (FabArrayBase *)
                std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                          ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                           0x52ea37);
      iVar5 = amrex::FabArrayBase::nComp(pFVar26);
      local_164 = iVar5 + local_164;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)in_stack_ffffffffffffe420);
    }
    sVar13 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        &local_f8);
    local_18c = (int)sVar13 + local_12c + local_164 + 1;
    amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               in_stack_ffffffffffffe420,(size_type)in_stack_ffffffffffffe418);
    local_198 = amrex::StateData::curTime
                          ((StateData *)
                           CONCAT17(in_stack_ffffffffffffe447,
                                    CONCAT16(in_stack_ffffffffffffe446,
                                             CONCAT15(in_stack_ffffffffffffe445,
                                                      CONCAT14(in_stack_ffffffffffffe444,
                                                               in_stack_ffffffffffffe440)))));
    if ((in_RDI->level == 0) &&
       (bVar3 = amrex::ParallelDescriptor::IOProcessor(), poVar21 = local_48, bVar3)) {
      (*in_RDI->_vptr_AmrLevel[3])(local_1b8);
      poVar21 = std::operator<<(poVar21,local_1b8);
      std::operator<<(poVar21,'\n');
      std::__cxx11::string::~string(local_1b8);
      if (local_18c == 0) {
        local_30 = "Must specify at least one valid data item to plot";
        amrex::Error_host((char *)in_stack_ffffffffffffe430);
      }
      poVar21 = (ostream *)std::ostream::operator<<(local_48,local_18c);
      std::operator<<(poVar21,'\n');
      for (local_1c0 = 0; uVar19 = local_1c0,
          sVar13 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                             ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              &local_f8), uVar19 < sVar13; local_1c0 = local_1c0 + 1) {
        pvVar24 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                  operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                             &local_f8,local_1c0);
        local_1c4 = pvVar24->first;
        pvVar24 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                  operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                             &local_f8,local_1c0);
        poVar21 = local_48;
        local_1c8 = pvVar24->second;
        amrex::DescriptorList::operator[]
                  ((DescriptorList *)in_stack_ffffffffffffe420,
                   (int)((ulong)in_stack_ffffffffffffe418 >> 0x20));
        psVar14 = amrex::StateDescriptor::name_abi_cxx11_
                            ((StateDescriptor *)in_stack_ffffffffffffe420,
                             (int)((ulong)in_stack_ffffffffffffe418 >> 0x20));
        poVar21 = std::operator<<(poVar21,(string *)psVar14);
        std::operator<<(poVar21,'\n');
      }
      local_1d8._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffe418);
      std::
      _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_List_const_iterator(&local_1d0,&local_1d8);
      local_1e8._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffe418);
      std::
      _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_List_const_iterator(&local_1e0,&local_1e8);
      while (bVar3 = std::operator!=(&local_1d0,&local_1e0), bVar3) {
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_ffffffffffffe420);
        local_1f0 = amrex::DeriveList::get
                              ((DeriveList *)in_stack_ffffffffffffe438,
                               (string *)in_stack_ffffffffffffe430);
        for (local_1f4 = 0; iVar5 = local_1f4, iVar6 = amrex::DeriveRec::numDerive(local_1f0),
            poVar21 = local_48, iVar5 < iVar6; local_1f4 = local_1f4 + 1) {
          psVar14 = amrex::DeriveRec::variableName_abi_cxx11_
                              (in_stack_ffffffffffffe428,
                               (int)((ulong)in_stack_ffffffffffffe420 >> 0x20));
          poVar21 = std::operator<<(poVar21,(string *)psVar14);
          std::operator<<(poVar21,'\n');
        }
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_1d0);
      }
      local_208._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffe418);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::_Rb_tree_const_iterator(&local_200,&local_208);
      local_218._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffe418);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::_Rb_tree_const_iterator(&local_210,&local_218);
      while (bVar3 = std::operator!=(&local_200,&local_210), bVar3) {
        local_220 = 0;
        while( true ) {
          lVar11 = local_220;
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)0x52eebe);
          LVar22 = amrex::
                   Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x52eeca);
          poVar21 = local_48;
          if (LVar22 <= lVar11) break;
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)0x52eef7);
          pbVar15 = amrex::
                    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)in_stack_ffffffffffffe420,(size_type)in_stack_ffffffffffffe418);
          poVar21 = std::operator<<(poVar21,(string *)pbVar15);
          std::operator<<(poVar21,'\n');
          local_220 = local_220 + 1;
        }
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)in_stack_ffffffffffffe420);
      }
      std::operator<<(local_48,"volFrac\n");
      poVar21 = (ostream *)std::ostream::operator<<(local_48,3);
      std::operator<<(poVar21,'\n');
      poVar21 = local_48;
      RVar1 = amrex::Amr::cumTime(in_RDI->parent);
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,RVar1);
      std::operator<<(poVar21,'\n');
      local_224 = amrex::AmrMesh::finestLevel((AmrMesh *)in_RDI->parent);
      poVar21 = (ostream *)std::ostream::operator<<(local_48,local_224);
      std::operator<<(poVar21,'\n');
      for (local_228 = 0; poVar21 = local_48, local_228 < 3; local_228 = local_228 + 1) {
        amrex::AmrLevel::Geom(in_RDI);
        RVar1 = amrex::Geometry::ProbLo
                          ((Geometry *)in_stack_ffffffffffffe420,
                           (int)((ulong)in_stack_ffffffffffffe418 >> 0x20));
        poVar21 = (ostream *)std::ostream::operator<<(poVar21,RVar1);
        std::operator<<(poVar21,' ');
      }
      std::operator<<(local_48,'\n');
      for (local_22c = 0; poVar21 = local_48, local_22c < 3; local_22c = local_22c + 1) {
        amrex::AmrLevel::Geom(in_RDI);
        RVar1 = amrex::Geometry::ProbHi
                          ((Geometry *)in_stack_ffffffffffffe420,
                           (int)((ulong)in_stack_ffffffffffffe418 >> 0x20));
        poVar21 = (ostream *)std::ostream::operator<<(poVar21,RVar1);
        std::operator<<(poVar21,' ');
      }
      std::operator<<(local_48,'\n');
      for (local_230 = 0; poVar21 = local_48, local_230 < local_224; local_230 = local_230 + 1) {
        IVar27 = amrex::AmrMesh::refRatio
                           (in_stack_ffffffffffffe430,
                            (int)((ulong)in_stack_ffffffffffffe428 >> 0x20));
        local_250[2] = IVar27.vect[2];
        local_238 = local_250[2];
        local_250._0_8_ = IVar27.vect._0_8_;
        local_240._0_4_ = local_250[0];
        local_240._4_4_ = local_250[1];
        uVar2 = local_240;
        local_20 = &local_240;
        local_24 = 0;
        local_240._0_4_ = IVar27.vect[0];
        iVar5 = (int)local_240;
        local_250 = IVar27.vect;
        local_240 = uVar2;
        poVar21 = (ostream *)std::ostream::operator<<(poVar21,iVar5);
        std::operator<<(poVar21,' ');
      }
      std::operator<<(local_48,'\n');
      for (local_254 = 0; local_254 <= local_224; local_254 = local_254 + 1) {
        pGVar16 = amrex::AmrMesh::Geom
                            ((AmrMesh *)in_stack_ffffffffffffe420,
                             (int)((ulong)in_stack_ffffffffffffe418 >> 0x20));
        amrex::Geometry::Domain(pGVar16);
        poVar21 = amrex::operator<<((ostream *)in_stack_ffffffffffffe458,
                                    (Box *)in_stack_ffffffffffffe450);
        std::operator<<(poVar21,' ');
      }
      std::operator<<(local_48,'\n');
      for (local_258 = 0; poVar21 = local_48, local_258 <= local_224; local_258 = local_258 + 1) {
        iVar5 = amrex::Amr::levelSteps
                          ((Amr *)in_stack_ffffffffffffe420,
                           (int)((ulong)in_stack_ffffffffffffe418 >> 0x20));
        poVar21 = (ostream *)std::ostream::operator<<(poVar21,iVar5);
        std::operator<<(poVar21,' ');
      }
      std::operator<<(local_48,'\n');
      for (local_25c = 0; poVar21 = local_48, local_25c <= local_224; local_25c = local_25c + 1) {
        for (local_260 = 0; poVar21 = local_48, local_260 < 3; local_260 = local_260 + 1) {
          pGVar16 = amrex::AmrMesh::Geom
                              ((AmrMesh *)in_stack_ffffffffffffe420,
                               (int)((ulong)in_stack_ffffffffffffe418 >> 0x20));
          pRVar17 = amrex::CoordSys::CellSize(&pGVar16->super_CoordSys);
          poVar21 = (ostream *)std::ostream::operator<<(poVar21,pRVar17[local_260]);
          std::operator<<(poVar21,' ');
        }
        std::operator<<(local_48,'\n');
      }
      pGVar16 = amrex::AmrLevel::Geom(in_RDI);
      CVar7 = amrex::CoordSys::Coord(&pGVar16->super_CoordSys);
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,CVar7);
      std::operator<<(poVar21,'\n');
      std::operator<<(local_48,"0\n");
      std::ofstream::ofstream(local_460);
      std::__cxx11::string::string(local_480,local_40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4a0,
                 "===============================================================================\n"
                 ,&local_4a1);
      std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
      std::__cxx11::string::operator+=(local_480,"/job_info");
      _Var8 = std::__cxx11::string::c_str();
      std::ofstream::open((char *)local_460,_Var8);
      std::operator<<(local_460,local_4a0);
      std::operator<<(local_460," Job Information\n");
      std::operator<<(local_460,local_4a0);
      poVar21 = std::operator<<(local_460,"number of MPI processes: ");
      iVar5 = amrex::ParallelDescriptor::NProcs();
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,iVar5);
      std::operator<<(poVar21,"\n");
      std::operator<<(local_460,"\n\n");
      std::operator<<(local_460,local_4a0);
      std::operator<<(local_460," Plotfile Information\n");
      std::operator<<(local_460,local_4a0);
      local_4b0 = ::time((time_t *)0x0);
      __tp = localtime(&local_4b0);
      poVar21 = std::operator<<(local_460,"output data / time: ");
      pcVar20 = asctime(__tp);
      std::operator<<(poVar21,pcVar20);
      pcVar20 = getcwd(local_14b8,0x1000);
      if (pcVar20 != (char *)0x0) {
        poVar21 = std::operator<<(local_460,"output dir:         ");
        poVar21 = std::operator<<(poVar21,local_14b8);
        std::operator<<(poVar21,"\n");
      }
      std::operator<<(local_460,"\n\n");
      std::operator<<(local_460,local_4a0);
      std::operator<<(local_460," Build Information\n");
      std::operator<<(local_460,local_4a0);
      poVar21 = std::operator<<(local_460,"build date:    ");
      pcVar20 = amrex::buildInfoGetBuildDate();
      poVar21 = std::operator<<(poVar21,pcVar20);
      std::operator<<(poVar21,"\n");
      poVar21 = std::operator<<(local_460,"build machine: ");
      pcVar20 = amrex::buildInfoGetBuildMachine();
      poVar21 = std::operator<<(poVar21,pcVar20);
      std::operator<<(poVar21,"\n");
      poVar21 = std::operator<<(local_460,"build dir:     ");
      pcVar20 = amrex::buildInfoGetBuildDir();
      poVar21 = std::operator<<(poVar21,pcVar20);
      std::operator<<(poVar21,"\n");
      poVar21 = std::operator<<(local_460,"BoxLib dir:    ");
      pcVar20 = amrex::buildInfoGetAMReXDir();
      poVar21 = std::operator<<(poVar21,pcVar20);
      std::operator<<(poVar21,"\n");
      std::operator<<(local_460,"\n");
      poVar21 = std::operator<<(local_460,"COMP:          ");
      pcVar20 = amrex::buildInfoGetComp();
      poVar21 = std::operator<<(poVar21,pcVar20);
      std::operator<<(poVar21,"\n");
      poVar21 = std::operator<<(local_460,"COMP version:  ");
      in_stack_ffffffffffffe5f8 = (string *)amrex::buildInfoGetCompVersion();
      in_stack_ffffffffffffe5f0 = std::operator<<(poVar21,(char *)in_stack_ffffffffffffe5f8);
      std::operator<<(in_stack_ffffffffffffe5f0,"\n");
      poVar21 = std::operator<<(local_460,"FCOMP:         ");
      pcVar20 = amrex::buildInfoGetFcomp();
      poVar21 = std::operator<<(poVar21,pcVar20);
      std::operator<<(poVar21,"\n");
      poVar21 = std::operator<<(local_460,"FCOMP version: ");
      pcVar20 = amrex::buildInfoGetFcompVersion();
      poVar21 = std::operator<<(poVar21,pcVar20);
      std::operator<<(poVar21,"\n");
      std::operator<<(local_460,"\n");
      local_14bc = 1;
      while( true ) {
        iVar5 = local_14bc;
        iVar6 = amrex::buildInfoGetNumModules();
        prettyPrint = (undefined1)((ulong)in_stack_ffffffffffffe488 >> 0x38);
        if (iVar6 < iVar5) break;
        pcVar20 = amrex::buildInfoGetModuleName(local_14bc);
        poVar21 = std::operator<<(local_460,pcVar20);
        poVar21 = std::operator<<(poVar21,": ");
        pcVar20 = amrex::buildInfoGetModuleVal(local_14bc);
        poVar21 = std::operator<<(poVar21,pcVar20);
        std::operator<<(poVar21,"\n");
        local_14bc = local_14bc + 1;
      }
      std::operator<<(local_460,"\n");
      local_14c8 = amrex::buildInfoGetGitHash(1);
      local_14d0 = amrex::buildInfoGetGitHash(2);
      local_14d8 = amrex::buildInfoGetGitHash(3);
      local_14e0 = amrex::buildInfoGetGitHash(4);
      local_14e8 = amrex::buildInfoGetGitHash(5);
      sVar18 = strlen(local_14c8);
      if (sVar18 != 0) {
        poVar21 = std::operator<<(local_460,"PeleLM git hash: ");
        poVar21 = std::operator<<(poVar21,local_14c8);
        std::operator<<(poVar21,"\n");
      }
      sVar18 = strlen(local_14d0);
      if (sVar18 != 0) {
        poVar21 = std::operator<<(local_460,"AMReX git hash: ");
        poVar21 = std::operator<<(poVar21,local_14d0);
        std::operator<<(poVar21,"\n");
      }
      sVar18 = strlen(local_14d8);
      if (sVar18 != 0) {
        poVar21 = std::operator<<(local_460,"IAMR   git hash: ");
        poVar21 = std::operator<<(poVar21,local_14d8);
        std::operator<<(poVar21,"\n");
      }
      sVar18 = strlen(local_14e0);
      if (sVar18 != 0) {
        poVar21 = std::operator<<(local_460,"AMReX-Hydro git hash: ");
        poVar21 = std::operator<<(poVar21,local_14e0);
        std::operator<<(poVar21,"\n");
      }
      sVar18 = strlen(local_14e0);
      if (sVar18 != 0) {
        poVar21 = std::operator<<(local_460,"PelePhysics git hash: ");
        poVar21 = std::operator<<(poVar21,local_14e8);
        std::operator<<(poVar21,"\n");
      }
      std::operator<<(local_460,"\n\n");
      std::operator<<(local_460,local_4a0);
      std::operator<<(local_460," Inputs File Parameters\n");
      std::operator<<(local_460,local_4a0);
      amrex::ParmParse::dumpTable(in_stack_ffffffffffffe490,(bool)prettyPrint);
      std::ofstream::close();
      std::__cxx11::string::~string(local_4a0);
      std::__cxx11::string::~string(local_480);
      std::ofstream::~ofstream(local_460);
    }
    if ((writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
         BaseName_abi_cxx11_ == '\0') &&
       (iVar5 = __cxa_guard_acquire(&writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)
                                     ::BaseName_abi_cxx11_), iVar5 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 &writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                  BaseName_abi_cxx11_,"/Cell",&local_14e9);
      std::allocator<char>::~allocator((allocator<char> *)&local_14e9);
      __cxa_atexit(std::__cxx11::string::~string,
                   &writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                    BaseName_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)
                           ::BaseName_abi_cxx11_);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1530,"Level_",&local_1531);
    amrex::Concatenate(in_stack_ffffffffffffe5f8,(int)((ulong)in_stack_ffffffffffffe5f0 >> 0x20),
                       (int)in_stack_ffffffffffffe5f0);
    std::__cxx11::string::~string(local_1530);
    std::allocator<char>::~allocator((allocator<char> *)&local_1531);
    std::__cxx11::string::string(local_1558,local_40);
    uVar19 = std::__cxx11::string::empty();
    if ((uVar19 & 1) == 0) {
      std::__cxx11::string::length();
      pcVar20 = (char *)std::__cxx11::string::operator[]((ulong)local_1558);
      if (*pcVar20 != '/') {
        std::__cxx11::string::operator+=(local_1558,'/');
      }
    }
    std::__cxx11::string::operator+=(local_1558,local_1510);
    bVar3 = amrex::ParallelDescriptor::IOProcessor();
    if ((bVar3) &&
       (bVar3 = amrex::UtilCreateDirectory
                          ((string *)in_stack_ffffffffffffe420,
                           (mode_t)((ulong)in_stack_ffffffffffffe418 >> 0x20),
                           SUB81((ulong)in_stack_ffffffffffffe418 >> 0x18,0)), !bVar3)) {
      amrex::CreateDirectoryFailed(in_stack_ffffffffffffe458);
    }
    iVar5 = (int)((ulong)in_stack_ffffffffffffe418 >> 0x20);
    amrex::ParallelDescriptor::Barrier((string *)amrex::ParallelDescriptor::Unnamed_abi_cxx11_);
    bVar3 = amrex::ParallelDescriptor::IOProcessor();
    if (bVar3) {
      poVar21 = (ostream *)std::ostream::operator<<(local_48,in_RDI->level);
      poVar21 = std::operator<<(poVar21,' ');
      LVar22 = amrex::BoxArray::size((BoxArray *)0x5302e4);
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,LVar22);
      poVar21 = std::operator<<(poVar21,' ');
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,local_198);
      std::operator<<(poVar21,'\n');
      poVar21 = local_48;
      iVar5 = amrex::Amr::levelSteps((Amr *)in_stack_ffffffffffffe420,iVar5);
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,iVar5);
      std::operator<<(poVar21,'\n');
      local_1560 = 0;
      while (lVar11 = local_1560, LVar22 = amrex::BoxArray::size((BoxArray *)0x5303d2),
            lVar11 < LVar22) {
        amrex::BoxArray::operator[]
                  ((BoxArray *)in_stack_ffffffffffffe430,
                   (int)((ulong)in_stack_ffffffffffffe428 >> 0x20));
        amrex::CoordSys::CellSize(&(in_RDI->geom).super_CoordSys);
        amrex::Geometry::ProbLo((Geometry *)0x530436);
        amrex::RealBox::RealBox
                  (in_stack_ffffffffffffe450,in_stack_ffffffffffffe448,
                   (Real *)CONCAT17(in_stack_ffffffffffffe447,
                                    CONCAT16(in_stack_ffffffffffffe446,
                                             CONCAT15(in_stack_ffffffffffffe445,
                                                      CONCAT14(in_stack_ffffffffffffe444,
                                                               in_stack_ffffffffffffe440)))),
                   (Real *)in_stack_ffffffffffffe438);
        for (local_15b0 = 0; local_15b0 < 3; local_15b0 = local_15b0 + 1) {
          poVar21 = local_48;
          RVar1 = amrex::RealBox::lo(&local_1590,local_15b0);
          poVar21 = (ostream *)std::ostream::operator<<(poVar21,RVar1);
          poVar21 = std::operator<<(poVar21,' ');
          RVar1 = amrex::RealBox::hi(&local_1590,local_15b0);
          poVar21 = (ostream *)std::ostream::operator<<(poVar21,RVar1);
          std::operator<<(poVar21,'\n');
        }
        local_1560 = local_1560 + 1;
      }
      if (0 < local_18c) {
        std::__cxx11::string::string(local_15d0,local_1510);
        std::__cxx11::string::operator+=
                  (local_15d0,
                   (string *)
                   &writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                    BaseName_abi_cxx11_);
        poVar21 = std::operator<<(local_48,local_15d0);
        std::operator<<(poVar21,'\n');
        std::__cxx11::string::~string(local_15d0);
      }
      iVar5 = in_RDI->level;
      iVar6 = amrex::AmrMesh::finestLevel((AmrMesh *)in_RDI->parent);
      if (iVar5 == iVar6) {
        for (local_15d4 = 0; iVar5 = local_15d4,
            iVar6 = amrex::AmrMesh::finestLevel((AmrMesh *)in_RDI->parent), iVar5 <= iVar6;
            local_15d4 = local_15d4 + 1) {
          std::operator<<(local_48,"1.0e-6\n");
        }
      }
    }
    local_15d8 = 0;
    local_15dc = 1;
    local_15e0 = 0;
    bxs = &in_RDI->grids;
    this_03 = &in_RDI->dmap;
    local_1778 = 0;
    uStack_1770 = 0;
    local_1788._vptr_FabFactory = (_func_int **)0x0;
    uStack_1780 = 0;
    local_1768 = 0;
    factory = &local_1788;
    amrex::MFInfo::MFInfo((MFInfo *)0x5306d0);
    this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
               *)amrex::AmrLevel::Factory((AmrLevel *)in_stack_ffffffffffffe420);
    amrex::MultiFab::MultiFab
              ((MultiFab *)this_03,bxs,(DistributionMapping *)in_stack_ffffffffffffe450,
               (int)((ulong)in_stack_ffffffffffffe448 >> 0x20),(int)in_stack_ffffffffffffe448,
               (MFInfo *)
               CONCAT17(in_stack_ffffffffffffe447,
                        CONCAT16(in_stack_ffffffffffffe446,
                                 CONCAT15(in_stack_ffffffffffffe445,
                                          CONCAT14(in_stack_ffffffffffffe444,
                                                   in_stack_ffffffffffffe440)))),factory);
    amrex::MFInfo::~MFInfo((MFInfo *)0x530718);
    local_1790 = (MultiFab *)0x0;
    local_1798 = (FabArray<amrex::FArrayBox> *)0x0;
    while (this_02 = local_1798,
          pFVar23 = (FabArray<amrex::FArrayBox> *)
                    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                               )&local_f8), this_02 < pFVar23) {
      in_stack_ffffffffffffe448 = &local_f8;
      pvVar24 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           in_stack_ffffffffffffe448,(size_type)local_1798);
      local_179c = pvVar24->first;
      pvVar24 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           in_stack_ffffffffffffe448,(size_type)local_1798);
      local_17a0 = pvVar24->second;
      amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                 in_stack_ffffffffffffe420,(size_type)this_00);
      local_1790 = amrex::StateData::newData((StateData *)in_stack_ffffffffffffe420);
      amrex::MultiFab::Copy
                ((MultiFab *)this_02,(MultiFab *)in_stack_ffffffffffffe448,
                 CONCAT13(in_stack_ffffffffffffe447,
                          CONCAT12(in_stack_ffffffffffffe446,
                                   CONCAT11(in_stack_ffffffffffffe445,in_stack_ffffffffffffe444))),
                 in_stack_ffffffffffffe440,(int)((ulong)in_stack_ffffffffffffe438 >> 0x20),
                 (int)in_stack_ffffffffffffe438);
      local_15d8 = local_15dc + local_15d8;
      local_1798 = (FabArray<amrex::FArrayBox> *)
                   ((long)&(((FabArray<amrex::FArrayBox> *)&local_1798->super_FabArrayBase)->
                           super_FabArrayBase)._vptr_FabArrayBase + 1);
    }
    sVar13 = std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffe420);
    if (sVar13 != 0) {
      local_17b8._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this_00);
      std::
      _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_List_const_iterator(&local_17b0,&local_17b8);
      local_17c8._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_00);
      std::
      _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_List_const_iterator(&local_17c0,&local_17c8);
      while (bVar3 = std::operator!=(&local_17b0,&local_17c0), bVar3) {
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_ffffffffffffe420);
        in_stack_ffffffffffffe447 =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffe420,(char *)this_00);
        if ((bool)in_stack_ffffffffffffe447) {
LAB_005309a3:
          this_01 = amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                               in_stack_ffffffffffffe420,(size_type)this_00);
          pSVar10 = amrex::StateData::descriptor(this_01);
          TVar9 = amrex::StateDescriptor::timeType(pSVar10);
          if (TVar9 == Interval) {
            local_17a8 = local_198;
          }
          else {
            local_17cc = amrex::AmrMesh::finestLevel((AmrMesh *)in_RDI->parent);
            in_stack_ffffffffffffe438 =
                 getLevel(in_stack_ffffffffffffe420,(int)((ulong)this_00 >> 0x20));
            amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                      ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                       in_stack_ffffffffffffe420,(size_type)this_00);
            local_17a8 = amrex::StateData::curTime
                                   ((StateData *)
                                    CONCAT17(in_stack_ffffffffffffe447,
                                             CONCAT16(in_stack_ffffffffffffe446,
                                                      CONCAT15(in_stack_ffffffffffffe445,
                                                               CONCAT14(in_stack_ffffffffffffe444,
                                                                        in_stack_ffffffffffffe440)))
                                            ));
          }
        }
        else {
          std::
          _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_ffffffffffffe420);
          in_stack_ffffffffffffe446 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffe420,(char *)this_00);
          if ((bool)in_stack_ffffffffffffe446) goto LAB_005309a3;
          std::
          _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_ffffffffffffe420);
          in_stack_ffffffffffffe445 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffe420,(char *)this_00);
          if ((bool)in_stack_ffffffffffffe445) goto LAB_005309a3;
          std::
          _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_ffffffffffffe420);
          in_stack_ffffffffffffe444 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffe420,(char *)this_00);
          if ((bool)in_stack_ffffffffffffe444) goto LAB_005309a3;
          local_17a8 = local_198;
        }
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_ffffffffffffe420);
        in_stack_ffffffffffffe430 =
             (AmrMesh *)
             amrex::DeriveList::get
                       ((DeriveList *)in_stack_ffffffffffffe438,(string *)in_stack_ffffffffffffe430)
        ;
        local_17d8 = in_stack_ffffffffffffe430;
        local_15dc = amrex::DeriveRec::numDerive((DeriveRec *)in_stack_ffffffffffffe430);
        pbVar25 = std::
                  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_ffffffffffffe420);
        (*in_RDI->_vptr_AmrLevel[0x1f])(SUB84(local_17a8,0),local_17e0,in_RDI,pbVar25,0);
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                   in_stack_ffffffffffffe420);
        amrex::MultiFab::Copy
                  ((MultiFab *)this_02,(MultiFab *)in_stack_ffffffffffffe448,
                   CONCAT13(in_stack_ffffffffffffe447,
                            CONCAT12(in_stack_ffffffffffffe446,
                                     CONCAT11(in_stack_ffffffffffffe445,in_stack_ffffffffffffe444)))
                   ,in_stack_ffffffffffffe440,(int)((ulong)in_stack_ffffffffffffe438 >> 0x20),
                   (int)in_stack_ffffffffffffe438);
        local_15d8 = local_15dc + local_15d8;
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                   in_stack_ffffffffffffe420);
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_17b0);
      }
    }
    local_17e8 = &in_RDI[6].field_0x288;
    local_17f0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
         ::begin(this_00);
    local_17f8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
         ::end(this_00);
    while (bVar3 = std::operator!=(&local_17f0,&local_17f8), bVar3) {
      local_1800 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                *)0x530bd7);
      pFVar26 = (FabArrayBase *)
                std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                          ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                           0x530bf0);
      local_1804 = amrex::FabArrayBase::nComp(pFVar26);
      in_stack_ffffffffffffe420 =
           (PeleLM *)
           std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                     ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                      in_stack_ffffffffffffe420);
      amrex::MultiFab::Copy
                ((MultiFab *)this_02,(MultiFab *)in_stack_ffffffffffffe448,
                 CONCAT13(in_stack_ffffffffffffe447,
                          CONCAT12(in_stack_ffffffffffffe446,
                                   CONCAT11(in_stack_ffffffffffffe445,in_stack_ffffffffffffe444))),
                 in_stack_ffffffffffffe440,(int)((ulong)in_stack_ffffffffffffe438 >> 0x20),
                 (int)in_stack_ffffffffffffe438);
      local_15d8 = local_1804 + local_15d8;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)in_stack_ffffffffffffe420);
    }
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (this_02,(value_type)in_stack_ffffffffffffe448,
               CONCAT13(in_stack_ffffffffffffe447,
                        CONCAT12(in_stack_ffffffffffffe446,
                                 CONCAT11(in_stack_ffffffffffffe445,in_stack_ffffffffffffe444))),
               in_stack_ffffffffffffe440,(int)((ulong)in_stack_ffffffffffffe438 >> 0x20));
    amrex::MultiFab::Copy
              ((MultiFab *)this_02,(MultiFab *)in_stack_ffffffffffffe448,
               CONCAT13(in_stack_ffffffffffffe447,
                        CONCAT12(in_stack_ffffffffffffe446,
                                 CONCAT11(in_stack_ffffffffffffe445,in_stack_ffffffffffffe444))),
               in_stack_ffffffffffffe440,(int)((ulong)in_stack_ffffffffffffe438 >> 0x20),
               (int)in_stack_ffffffffffffe438);
    amrex::EB_set_covered((MultiFab *)in_stack_ffffffffffffe420,(Real)this_00);
    std::__cxx11::string::string(local_1828,local_1558);
    std::__cxx11::string::operator+=
              (local_1828,
               (string *)
               &writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                BaseName_abi_cxx11_);
    amrex::VisMF::Write(in_stack_fffffffffffff390,in_stack_fffffffffffff388,
                        in_stack_fffffffffffff384,(bool)in_stack_fffffffffffff383);
    std::__cxx11::string::~string(local_1828);
    amrex::MultiFab::~MultiFab((MultiFab *)0x530d31);
    std::__cxx11::string::~string(local_1558);
    std::__cxx11::string::~string(local_1510);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x530d58);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               in_stack_ffffffffffffe430);
    amrex::ParmParse::~ParmParse((ParmParse *)0x530d72);
  }
  return;
}

Assistant:

void
PeleLM::writePlotFile (const std::string& dir,
                       std::ostream&  os,
                       VisMF::How     how)
{
  if ( ! Amr::Plot_Files_Output() ) return;

  ParmParse pp("ht");

  pp.query("plot_rhoydot",plot_rhoydot);
  //
  // Note that this is really the same as its NavierStokes counterpart,
  // but in order to add diagnostic MultiFabs into the plotfile, code had
  // to be interspersed within this function.
  //

  //
  // The list of indices of State to write to plotfile.
  // first component of pair is state_type,
  // second component of pair is component # within the state_type
  //
  std::vector<std::pair<int,int> > plot_var_map;
  for (long int typ = 0; typ < desc_lst.size(); typ++)
  {
    for (int comp = 0; comp < desc_lst[typ].nComp();comp++)
    {
      const std::string& name = desc_lst[typ].name(comp);

      if (parent->isStatePlotVar(name) && desc_lst[typ].getType() == IndexType::TheCellType())
      {
        //
        // When running SDC we get things of this form in the State.
        // I want a simple way not to write'm out to plotfiles.
        //
        if (name.find("I_R[") != std::string::npos)
        {
          if (plot_rhoydot)
            plot_var_map.push_back(std::pair<int,int>(typ,comp));
        }
        else
        {
          plot_var_map.push_back(std::pair<int,int>(typ,comp));
        }
      }
    }
  }

  int num_derive = 0;
  std::list<std::string> derive_names;
  const std::list<DeriveRec>& dlist = derive_lst.dlist();

  for (std::list<DeriveRec>::const_iterator it = dlist.begin(), end = dlist.end();
       it != end;
       ++it)
  {
    if (parent->isDerivePlotVar(it->name()))
    {
      derive_names.push_back(it->name());
      num_derive += it->numDerive();
    }
  }

  int num_auxDiag = 0;
  for (const auto& kv : auxDiag)
  {
    num_auxDiag += kv.second->nComp();
  }

  int n_data_items = plot_var_map.size() + num_derive + num_auxDiag;

#ifdef AMREX_USE_EB
    // add in vol frac
    n_data_items++;
#endif

  Real tnp1 = state[State_Type].curTime();

  if (level == 0 && ParallelDescriptor::IOProcessor())
  {
    //
    // The first thing we write out is the plotfile type.
    //
    os << thePlotFileType() << '\n';

    if (n_data_items == 0)
      amrex::Error("Must specify at least one valid data item to plot");

    os << n_data_items << '\n';

    //
    // Names of variables -- first state, then derived
    //
    for (long unsigned int i =0; i < plot_var_map.size(); i++)
    {
      int typ  = plot_var_map[i].first;
      int comp = plot_var_map[i].second;
      os << desc_lst[typ].name(comp) << '\n';
    }

    for (std::list<std::string>::const_iterator it = derive_names.begin(), end = derive_names.end();
         it != end;
         ++it)
    {
      const DeriveRec* rec = derive_lst.get(*it);
      for (int i = 0; i < rec->numDerive(); i++)
        os << rec->variableName(i) << '\n';
    }

    //
    // Hack in additional diagnostics.
    //
    for (std::map<std::string,Vector<std::string> >::const_iterator it = auxDiag_names.begin(), end = auxDiag_names.end();
         it != end;
         ++it)
    {
      for (long int i=0; i<it->second.size(); ++i)
        os << it->second[i] << '\n';
    }

#ifdef AMREX_USE_EB
    //add in vol frac
    os << "volFrac\n";
#endif

    os << AMREX_SPACEDIM << '\n';
    os << parent->cumTime() << '\n';
    int f_lev = parent->finestLevel();
    os << f_lev << '\n';
    for (int i = 0; i < AMREX_SPACEDIM; i++)
      os << Geom().ProbLo(i) << ' ';
    os << '\n';
    for (int i = 0; i < AMREX_SPACEDIM; i++)
      os << Geom().ProbHi(i) << ' ';
    os << '\n';
    for (int i = 0; i < f_lev; i++)
      os << parent->refRatio(i)[0] << ' ';
    os << '\n';
    for (int i = 0; i <= f_lev; i++)
      os << parent->Geom(i).Domain() << ' ';
    os << '\n';
    for (int i = 0; i <= f_lev; i++)
      os << parent->levelSteps(i) << ' ';
    os << '\n';
    for (int i = 0; i <= f_lev; i++)
    {
      for (int k = 0; k < AMREX_SPACEDIM; k++)
        os << parent->Geom(i).CellSize()[k] << ' ';
      os << '\n';
    }
    os << (int) Geom().Coord() << '\n';
    os << "0\n"; // Write bndry data.

    // job_info file with details about the run
    std::ofstream jobInfoFile;
    std::string FullPathJobInfoFile = dir;
    std::string PrettyLine = "===============================================================================\n";

    FullPathJobInfoFile += "/job_info";
    jobInfoFile.open(FullPathJobInfoFile.c_str(), std::ios::out);

    // job information
    jobInfoFile << PrettyLine;
    jobInfoFile << " Job Information\n";
    jobInfoFile << PrettyLine;

    jobInfoFile << "number of MPI processes: " << ParallelDescriptor::NProcs() << "\n";
#ifdef AMREX_USE_OMP
    jobInfoFile << "number of threads:       " << omp_get_max_threads() << "\n";
#endif
    jobInfoFile << "\n\n";

    // plotfile information
    jobInfoFile << PrettyLine;
    jobInfoFile << " Plotfile Information\n";
    jobInfoFile << PrettyLine;

    time_t now = time(0);

    // Convert now to tm struct for local timezone
    tm* localtm = localtime(&now);
    jobInfoFile   << "output data / time: " << asctime(localtm);

    char currentDir[FILENAME_MAX];
    if (getcwd(currentDir, FILENAME_MAX)) {
      jobInfoFile << "output dir:         " << currentDir << "\n";
    }

    jobInfoFile << "\n\n";


    // build information
    jobInfoFile << PrettyLine;
    jobInfoFile << " Build Information\n";
    jobInfoFile << PrettyLine;

    jobInfoFile << "build date:    " << buildInfoGetBuildDate() << "\n";
    jobInfoFile << "build machine: " << buildInfoGetBuildMachine() << "\n";
    jobInfoFile << "build dir:     " << buildInfoGetBuildDir() << "\n";
    jobInfoFile << "BoxLib dir:    " << buildInfoGetAMReXDir() << "\n";

    jobInfoFile << "\n";

    jobInfoFile << "COMP:          " << buildInfoGetComp() << "\n";
    jobInfoFile << "COMP version:  " << buildInfoGetCompVersion() << "\n";
    jobInfoFile << "FCOMP:         " << buildInfoGetFcomp() << "\n";
    jobInfoFile << "FCOMP version: " << buildInfoGetFcompVersion() << "\n";

    jobInfoFile << "\n";

    for (int nn = 1; nn <= buildInfoGetNumModules(); nn++) {
      jobInfoFile << buildInfoGetModuleName(nn) << ": " << buildInfoGetModuleVal(nn) << "\n";
    }

    jobInfoFile << "\n";

    const char* githash1 = buildInfoGetGitHash(1);
    const char* githash2 = buildInfoGetGitHash(2);
    const char* githash3 = buildInfoGetGitHash(3);
    const char* githash4 = buildInfoGetGitHash(4);
    const char* githash5 = buildInfoGetGitHash(5);
    if (strlen(githash1) > 0) {
      jobInfoFile << "PeleLM git hash: " << githash1 << "\n";
    }
    if (strlen(githash2) > 0) {
      jobInfoFile << "AMReX git hash: " << githash2 << "\n";
    }
    if (strlen(githash3) > 0) {
      jobInfoFile << "IAMR   git hash: " << githash3 << "\n";
    }
    if (strlen(githash4) > 0) {
      jobInfoFile << "AMReX-Hydro git hash: " << githash4 << "\n";
    }
    if (strlen(githash4) > 0) {
      jobInfoFile << "PelePhysics git hash: " << githash5 << "\n";
    }

    jobInfoFile << "\n\n";


    // runtime parameters
    jobInfoFile << PrettyLine;
    jobInfoFile << " Inputs File Parameters\n";
    jobInfoFile << PrettyLine;

    ParmParse::dumpTable(jobInfoFile, true);

    jobInfoFile.close();

  }
  // Build the directory to hold the MultiFab at this level.
  // The name is relative to the directory containing the Header file.
  //
  static const std::string BaseName = "/Cell";

  std::string LevelStr = amrex::Concatenate("Level_", level, 1);
  //
  // Now for the full pathname of that directory.
  //
  std::string FullPath = dir;
  if (!FullPath.empty() && FullPath[FullPath.length()-1] != '/')
    FullPath += '/';
  FullPath += LevelStr;
  //
  // Only the I/O processor makes the directory if it doesn't already exist.
  //
  if (ParallelDescriptor::IOProcessor())
    if (!amrex::UtilCreateDirectory(FullPath, 0755))
      amrex::CreateDirectoryFailed(FullPath);
  //
  // Force other processors to wait till directory is built.
  //
  ParallelDescriptor::Barrier();

  if (ParallelDescriptor::IOProcessor())
  {
    os << level << ' ' << grids.size() << ' ' << tnp1 << '\n';
    os << parent->levelSteps(level) << '\n';

    for (long int i = 0; i < grids.size(); ++i)
    {
      RealBox gridloc = RealBox(grids[i],geom.CellSize(),geom.ProbLo());
      for (int n = 0; n < AMREX_SPACEDIM; n++)
        os << gridloc.lo(n) << ' ' << gridloc.hi(n) << '\n';
    }
    //
    // The full relative pathname of the MultiFabs at this level.
    // The name is relative to the Header file containing this name.
    // It's the name that gets written into the Header.
    //
    if (n_data_items > 0)
    {
      std::string PathNameInHeader = LevelStr;
      PathNameInHeader += BaseName;
      os << PathNameInHeader << '\n';
    }

#ifdef AMREX_USE_EB
    // volfrac threshhold for amrvis
    // fixme? pulled directly from CNS, might need adjustment
        if (level == parent->finestLevel()) {
            for (int lev = 0; lev <= parent->finestLevel(); ++lev) {
                os << "1.0e-6\n";
            }
        }
#endif


  }
  //
  // We combine all of the multifabs -- state, derived, etc -- into one
  // multifab -- plotMF.
  // NOTE: we are assuming that each state variable has one component,
  // but a derived variable is allowed to have multiple components.
  int       cnt   = 0;
  int       ncomp = 1;
  const int nGrow = 0;
  //MultiFab  plotMF(grids,dmap,n_data_items,nGrow);
  MultiFab plotMF(grids,dmap,n_data_items,nGrow,MFInfo(),Factory());
  MultiFab* this_dat = 0;
  //
  // Cull data from state variables -- use no ghost cells.
  //
  for (long unsigned int i = 0; i < plot_var_map.size(); i++)
  {
    int typ  = plot_var_map[i].first;
    int comp = plot_var_map[i].second;
    this_dat = &state[typ].newData();
    MultiFab::Copy(plotMF,*this_dat,comp,cnt,ncomp,nGrow);
    cnt+= ncomp;
  }
  //
  // Cull data from derived variables.
  //
  Real plot_time;

  if (derive_names.size() > 0)
  {
    for (std::list<std::string>::const_iterator it = derive_names.begin(), end = derive_names.end();
         it != end;
         ++it)
    {
      if (*it == "avg_pressure" ||
          *it == "gradpx"       ||
          *it == "gradpy"       ||
          *it == "gradpz")
      {
        if (state[Press_Type].descriptor()->timeType() ==
            StateDescriptor::Interval)
        {
          plot_time = tnp1;
        }
        else
        {
          int f_lev = parent->finestLevel();
          plot_time = getLevel(f_lev).state[Press_Type].curTime();
        }
      }
      else
      {
        plot_time = tnp1;
      }
      const DeriveRec* rec = derive_lst.get(*it);
      ncomp = rec->numDerive();
      auto derive_dat = derive(*it,plot_time,nGrow);
      MultiFab::Copy(plotMF,*derive_dat,0,cnt,ncomp,nGrow);
      cnt += ncomp;
    }
  }


  //
  // Cull data from diagnostic multifabs.
  //
  for (const auto& kv : auxDiag)
  {
      int nComp = kv.second->nComp();
      MultiFab::Copy(plotMF,*kv.second,0,cnt,nComp,nGrow);
      cnt += nComp;
  }

#ifdef AMREX_USE_EB
    // add volume fraction to plotfile
    plotMF.setVal(0.0, cnt, 1, nGrow);
    MultiFab::Copy(plotMF,*volfrac,0,cnt,1,nGrow);

    // set covered values for ease of viewing
    EB_set_covered(plotMF, 0.0);
#endif

  //
  // Use the Full pathname when naming the MultiFab.
  //
  std::string TheFullPath = FullPath;
  TheFullPath += BaseName;

//#ifdef AMREX_USE_EB
//  bool plot_centroid_data = true;
//  pp.query("plot_centroid_data",plot_centroid_data);
//  if (plot_centroid_data) {
//    MultiFab TT(grids,dmap,plotMF.nComp(),plotMF.nGrow()+1,MFInfo(),Factory());
//    MultiFab::Copy(TT,plotMF,0,0,plotMF.nComp(),plotMF.nGrow());
//    TT.FillBoundary(geom.periodicity());
//    EB_interp_CC_to_Centroid(plotMF,TT,0,0,plotMF.nComp(),geom);
//  }
//#endif

  VisMF::Write(plotMF,TheFullPath,how);
}